

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InteractionCostCalculator.cpp
# Opt level: O0

tuple<int,_int,_int> __thiscall
multi_agent_planning::InteractionCostCalculator::getCostWithInteractions
          (InteractionCostCalculator *this,Edge edge,int time,int cost)

{
  bool bVar1;
  mapped_type *this_00;
  reference __t;
  __tuple_element_t<1UL,_tuple<int,_PlannedAction,_int>_> *p_Var2;
  __tuple_element_t<2UL,_tuple<int,_PlannedAction,_int>_> *p_Var3;
  int in_ECX;
  undefined4 in_register_00000034;
  map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
  *this_01;
  tuple<int,_int,_int> tVar4;
  out_of_range anon_var_0;
  tuple<int,_multi_agent_planning::PlannedAction,_int> *i;
  const_iterator __end2;
  const_iterator __begin2;
  PlannedActionList *__range2;
  PlannedActionList *interactions;
  int local_28;
  int num_synergies;
  int num_conflicts;
  int inter_dependent_cost;
  int cost_local;
  int time_local;
  InteractionCostCalculator *this_local;
  
  this_01 = (map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
             *)CONCAT44(in_register_00000034,time);
  local_28 = 0;
  num_synergies = in_ECX;
  inter_dependent_cost = cost;
  _cost_local = this_01;
  this_local = this;
  this_00 = std::
            map<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>,_std::less<boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>_>,_std::allocator<std::pair<const_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>_>_>
            ::at(this_01,&edge);
  __end2 = std::
           vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
           ::begin(this_00);
  i = (tuple<int,_multi_agent_planning::PlannedAction,_int> *)
      std::
      vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>
      ::end(this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::tuple<int,_multi_agent_planning::PlannedAction,_int>_*,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>
                                     *)&i), bVar1) {
    __t = __gnu_cxx::
          __normal_iterator<const_std::tuple<int,_multi_agent_planning::PlannedAction,_int>_*,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>
          ::operator*(&__end2);
    p_Var2 = std::get<1ul,int,multi_agent_planning::PlannedAction,int>(__t);
    if (p_Var2->start_time == inter_dependent_cost) {
      p_Var3 = std::get<2ul,int,multi_agent_planning::PlannedAction,int>(__t);
      if (0 < *p_Var3) {
        local_28 = local_28 + 1;
      }
      p_Var3 = std::get<2ul,int,multi_agent_planning::PlannedAction,int>(__t);
      num_synergies =
           (int)((float)*p_Var3 * *(float *)&this_01[1]._M_t._M_impl + (float)num_synergies);
    }
    __gnu_cxx::
    __normal_iterator<const_std::tuple<int,_multi_agent_planning::PlannedAction,_int>_*,_std::vector<std::tuple<int,_multi_agent_planning::PlannedAction,_int>,_std::allocator<std::tuple<int,_multi_agent_planning::PlannedAction,_int>_>_>_>
    ::operator++(&__end2);
  }
  if (num_synergies < 0) {
    num_synergies = 0;
  }
  tVar4 = std::make_tuple<int&,int&,int&>((int *)this,&num_synergies,&local_28);
  tVar4.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int> =
       (_Tuple_impl<1UL,_int,_int>)this;
  return (tuple<int,_int,_int>)tVar4.super__Tuple_impl<0UL,_int,_int,_int>;
}

Assistant:

std::tuple<int, int, int> InteractionCostCalculator::getCostWithInteractions(Edge edge, int time, int cost) const {

	int inter_dependent_cost = cost;
	int num_conflicts = 0;
	int num_synergies = 0;

	try {
		const PlannedActionList& interactions = interactionMap.at(edge);

		for (auto const& i : interactions) {
			if (get<1>(i).start_time == time) {

				if (get<2>(i) > 0) {
					num_conflicts++;
				}
				else if (inter_dependent_cost > 0) {
					num_synergies++;
				}

				inter_dependent_cost += get<2>(i) * alpha;
			}
		}
	}
	catch (std::out_of_range) {}

	if (inter_dependent_cost < 0) {
		inter_dependent_cost = 0;
	}

	return make_tuple(inter_dependent_cost, num_conflicts, num_synergies);
}